

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

void sigvcf_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  ptVar2 = gensym("vcf~");
  sigvcf_class = class_new(ptVar2,sigvcf_new,(t_method)0x0,0x48,0,A_DEFFLOAT,0);
  class_domainsignalin(sigvcf_class,0x40);
  p_Var1 = sigvcf_class;
  ptVar2 = gensym("dsp");
  class_addmethod(p_Var1,sigvcf_dsp,ptVar2,A_CANT,0);
  p_Var1 = sigvcf_class;
  ptVar2 = gensym("ft1");
  class_addmethod(p_Var1,sigvcf_ft1,ptVar2,A_FLOAT,0);
  return;
}

Assistant:

static
void sigvcf_setup(void)
{
    sigvcf_class = class_new(gensym("vcf~"), (t_newmethod)sigvcf_new, 0,
        sizeof(t_sigvcf), 0, A_DEFFLOAT, 0);
    CLASS_MAINSIGNALIN(sigvcf_class, t_sigvcf, x_f);
    class_addmethod(sigvcf_class, (t_method)sigvcf_dsp,
        gensym("dsp"), A_CANT, 0);
    class_addmethod(sigvcf_class, (t_method)sigvcf_ft1,
        gensym("ft1"), A_FLOAT, 0);
}